

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O2

void __thiscall Imf_2_5::FastHufDecoder::buildTables(FastHufDecoder *this,Int64 *base,Int64 *offset)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  int i;
  long lVar4;
  InputExc *this_00;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  Int64 IVar8;
  Int64 IVar9;
  bool bVar10;
  
  bVar5 = 0;
  for (lVar4 = 0; lVar4 != 0x3b; lVar4 = lVar4 + 1) {
    IVar9 = base[lVar4] << (bVar5 & 0x3f);
    if (base[lVar4] == 0xffffffffffffffff) {
      IVar9 = 0xffffffffffffffff;
    }
    this->_ljBase[lVar4] = IVar9;
    bVar5 = bVar5 - 1;
  }
  IVar9 = this->_ljBase[0];
  this->_ljOffset[0] = *offset - IVar9;
  bVar5 = 0x3f;
  for (lVar4 = 0; lVar4 != 0x3a; lVar4 = lVar4 + 1) {
    this->_ljOffset[lVar4 + 1] = offset[lVar4 + 1] - (this->_ljBase[lVar4 + 1] >> (bVar5 & 0x3f));
    bVar5 = bVar5 - 1;
  }
  bVar5 = this->_minCodeLength;
  bVar1 = this->_maxCodeLength;
  iVar2 = this->_numSymbols;
  piVar3 = this->_idToSymbol;
  for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
    this->_tableSymbol[lVar4] = 0xffff;
    this->_tableCodeLen[lVar4] = '\0';
    for (uVar7 = (ulong)bVar5; uVar7 <= bVar1; uVar7 = uVar7 + 1) {
      if (this->_ljBase[uVar7] <= (ulong)(lVar4 << 0x34)) {
        this->_tableCodeLen[lVar4] = (uchar)uVar7;
        uVar7 = ((ulong)(lVar4 << 0x34) >> (-(uchar)uVar7 & 0x3f)) + this->_ljOffset[uVar7];
        if ((ulong)(long)iVar2 <= uVar7) {
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(this_00,"Huffman decode error (Overrun).");
          __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        this->_tableSymbol[lVar4] = piVar3[uVar7];
        break;
      }
    }
  }
  uVar7 = 0xc;
  uVar6 = 0xc;
  do {
    bVar10 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    IVar8 = IVar9;
    if (bVar10) break;
    IVar8 = this->_ljBase[uVar7];
    uVar7 = (ulong)uVar6;
  } while (IVar8 == 0xffffffffffffffff);
  this->_tableMin = IVar8;
  return;
}

Assistant:

void
FastHufDecoder::buildTables (Int64 *base, Int64 *offset)
{
    //
    // Build the 'left justified' base table, by shifting base left..
    //

    for (int i = 0; i <= MAX_CODE_LEN; ++i)
    {
        if (base[i] != 0xffffffffffffffffULL)
        {
            _ljBase[i] = base[i] << (64 - i);
        }
        else
        {
            //
            // Unused code length - insert dummy values
            //

            _ljBase[i] = 0xffffffffffffffffULL;
        }
    }

    //
    // Combine some terms into a big fat constant, which for
    // lack of a better term we'll call the 'left justified' 
    // offset table (because it serves the same function
    // as 'offset', when using the left justified base table.
    //

    _ljOffset[0] = offset[0] - _ljBase[0];
    for (int i = 1; i <= MAX_CODE_LEN; ++i)
        _ljOffset[i] = offset[i] - (_ljBase[i] >> (64 - i));

    //
    // Build the acceleration tables for the lookups of
    // short codes ( <= TABLE_LOOKUP_BITS long)
    //

    for (Int64 i = 0; i < 1 << TABLE_LOOKUP_BITS; ++i)
    {
        Int64 value = i << (64 - TABLE_LOOKUP_BITS);

        _tableSymbol[i]  = 0xffff;
        _tableCodeLen[i] = 0; 

        for (int codeLen = _minCodeLength; codeLen <= _maxCodeLength; ++codeLen)
        {
            if (_ljBase[codeLen] <= value)
            {
                _tableCodeLen[i] = codeLen;

                Int64 id = _ljOffset[codeLen] + (value >> (64 - codeLen));
                if (id < static_cast<Int64>(_numSymbols))
                {
                    _tableSymbol[i] = _idToSymbol[id];
                }
                else
                {
                    throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                                   "(Overrun).");
                }
                break;
            }
        }
    }

    //
    // Store the smallest value in the table that points to real data.
    // This should be the entry for the largest length that has 
    // valid data (in our case, non-dummy _ljBase)
    //

    int minIdx = TABLE_LOOKUP_BITS;

    while (minIdx > 0 && _ljBase[minIdx] == 0xffffffffffffffffULL)
        minIdx--;

    if (minIdx < 0)
    {
        //
        // Error, no codes with lengths 0-TABLE_LOOKUP_BITS used.
        // Set the min value such that the table is never tested.
        //

        _tableMin = 0xffffffffffffffffULL;
    }
    else
    {
        _tableMin = _ljBase[minIdx];
    }
}